

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O0

string * __thiscall
flatbuffers::(anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Type *type,bool element_type,bool enum_inner)

{
  bool bVar1;
  Enum *this_00;
  String *pSVar2;
  Object *this_01;
  BaseType local_1e4;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined4 local_19c;
  string local_198;
  undefined1 local_178 [8];
  string type_name_1;
  string importns_1;
  Object *type_obj;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_90;
  undefined1 local_70 [8];
  string type_name;
  string importns;
  Enum *type_enum;
  BaseType base_type;
  bool enum_inner_local;
  bool element_type_local;
  Type *type_local;
  NimBfbsGenerator *this_local;
  
  if (element_type) {
    local_1e4 = reflection::Type::element(type);
  }
  else {
    local_1e4 = reflection::Type::base_type(type);
  }
  bVar1 = IsScalar(local_1e4);
  if (((!bVar1) || (enum_inner)) ||
     (this_00 = BaseBfbsGenerator::GetEnum((BaseBfbsGenerator *)this,type,element_type),
     this_00 == (Enum *)0x0)) {
    bVar1 = IsScalar(local_1e4);
    if (bVar1) {
      GenerateType_abi_cxx11_(&local_e0,this,local_1e4);
      anon_unknown_0::NimBfbsGenerator::Denamespace
                (__return_storage_ptr__,(NimBfbsGenerator *)this,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    else {
      switch(local_1e4) {
      case String:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"string",&local_e1);
        std::allocator<char>::~allocator(&local_e1);
        break;
      case Vector:
        GenerateType_abi_cxx11_(&local_128,this,type,true,false);
        std::operator+(&local_108,"seq[",&local_128);
        std::operator+(__return_storage_ptr__,&local_108,"]");
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        break;
      case Obj:
        this_01 = BaseBfbsGenerator::GetObject((BaseBfbsGenerator *)this,type,element_type);
        std::__cxx11::string::string((string *)(type_name_1.field_2._M_local_buf + 8));
        pSVar2 = reflection::Object::name(this_01);
        String::str_abi_cxx11_(&local_198,pSVar2);
        anon_unknown_0::NimBfbsGenerator::Denamespace
                  ((string *)local_178,(NimBfbsGenerator *)this,&local_198,
                   (string *)((long)&type_name_1.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_198);
        if (this_01 == *(Object **)((long)this + 0xb8)) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_178);
        }
        else {
          std::operator+(&local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type_name_1.field_2 + 8),".");
          std::operator+(__return_storage_ptr__,&local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_178);
          std::__cxx11::string::~string((string *)&local_1c0);
        }
        local_19c = 1;
        std::__cxx11::string::~string((string *)local_178);
        std::__cxx11::string::~string((string *)(type_name_1.field_2._M_local_buf + 8));
        break;
      case Union:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"Vtable",
                   (allocator<char> *)((long)&type_obj + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&type_obj + 7));
        break;
      default:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"uoffset",&local_1c1);
        std::allocator<char>::~allocator(&local_1c1);
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)(type_name.field_2._M_local_buf + 8));
    pSVar2 = reflection::Enum::name(this_00);
    String::str_abi_cxx11_(&local_90,pSVar2);
    anon_unknown_0::NimBfbsGenerator::Denamespace
              ((string *)local_70,(NimBfbsGenerator *)this,&local_90,
               (string *)((long)&type_name.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_90);
    std::operator+(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&type_name.field_2 + 8),".");
    std::operator+(__return_storage_ptr__,&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(type_name.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateType(const r::Type *type, bool element_type = false,
                           bool enum_inner = false) const {
    const r::BaseType base_type =
        element_type ? type->element() : type->base_type();
    if (IsScalar(base_type) && !enum_inner) {
      const r::Enum *type_enum = GetEnum(type, element_type);
      if (type_enum != nullptr) {
        std::string importns;
        std::string type_name = Denamespace(type_enum->name()->str(), importns);
        return importns + "." + type_name;
      }
    }
    if (IsScalar(base_type)) { return Denamespace(GenerateType(base_type)); }
    switch (base_type) {
      case r::String: return "string";
      case r::Vector: {
        return "seq[" + GenerateType(type, true) + "]";
      }
      case r::Union: return "Vtable";
      case r::Obj: {
        const r::Object *type_obj = GetObject(type, element_type);
        std::string importns;
        std::string type_name = Denamespace(type_obj->name()->str(), importns);
        if (type_obj == current_obj_) {
          return type_name;
        } else {
          return importns + "." + type_name;
        }
      }
      default: return "uoffset";
    }
  }